

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_handler.hpp
# Opt level: O2

void wigwag::detail::
     async_handler<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::life_assurance::intrusive_life_tokens>
     ::invoke_func<CollectionOp&,int_const&,std::__cxx11::string_const&>
               (life_checker *checker,
               function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *func,CollectionOp *args,int *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  execution_guard g;
  execution_guard local_40;
  
  life_assurance::intrusive_life_tokens::execution_guard::execution_guard(&local_40,checker);
  if (local_40._alive != 0) {
    std::
    function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(func,*args,args_1,args_2);
  }
  life_assurance::intrusive_life_tokens::execution_guard::~execution_guard(&local_40);
  return;
}

Assistant:

static void invoke_func(life_checker checker, const std::function<Signature_>& func, Args_&&... args)
        {
            execution_guard g(checker);
            if (g.is_alive())
                func(std::forward<Args_>(args)...);
        }